

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O2

void duckdb::BitStringAggOperation::
     Operation<unsigned_char,duckdb::BitAggState<unsigned_char>,duckdb::BitStringAggOperation>
               (BitAggState<unsigned_char> *state,uchar *input,AggregateUnaryInput *unary_input)

{
  uchar uVar1;
  byte bVar2;
  uchar max;
  FunctionData *pFVar3;
  idx_t iVar4;
  ulong uVar5;
  void *__src;
  BinderException *this;
  OutOfRangeException *pOVar6;
  InvalidInputException *this_00;
  allocator local_131;
  anon_union_16_2_67f50693_for_value local_130 [2];
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pFVar3 = optional_ptr<duckdb::FunctionData,_true>::operator->(&unary_input->input->bind_data);
  if (state->is_set == false) {
    if ((pFVar3[0x20] != (FunctionData)0x0) || (pFVar3[0x60] == (FunctionData)0x1)) {
      this = (BinderException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_130[0].pointer,
                 "Could not retrieve required statistics. Alternatively, try by providing the statistics explicitly: BITSTRING_AGG(col, min, max) "
                 ,&local_131);
      duckdb::BinderException::BinderException(this,(string *)&local_130[0].pointer);
      __cxa_throw(this,&BinderException::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar1 = duckdb::Value::GetValue<unsigned_char>();
    state->min = uVar1;
    bVar2 = duckdb::Value::GetValue<unsigned_char>();
    state->max = bVar2;
    if (bVar2 < state->min) {
      this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_130[0].pointer,
                 "Invalid explicit bitstring range: Minimum (%s) > maximum (%s)",&local_131);
      NumericHelper::ToString<unsigned_char>(&local_50,state->min);
      NumericHelper::ToString<unsigned_char>(&local_70,state->max);
      InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
                (this_00,(string *)&local_130[0].pointer,&local_50,&local_70);
      __cxa_throw(this_00,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar1 = duckdb::Value::GetValue<unsigned_char>();
    max = duckdb::Value::GetValue<unsigned_char>();
    iVar4 = GetRange<unsigned_char>(uVar1,max);
    if (1000000000 < iVar4) {
      pOVar6 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_130[0].pointer,
                 "The range between min and max value (%s <-> %s) is too large for bitstring aggregation"
                 ,&local_131);
      NumericHelper::ToString<unsigned_char>(&local_90,state->min);
      NumericHelper::ToString<unsigned_char>(&local_b0,state->max);
      OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
                (pOVar6,(string *)&local_130[0].pointer,&local_90,&local_b0);
      __cxa_throw(pOVar6,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar5 = duckdb::Bit::ComputeBitstringLen(iVar4);
    local_130[0]._0_4_ = (undefined4)uVar5;
    if (0xc < uVar5) {
      __src = operator_new__(uVar5);
      if ((uint)local_130[0]._0_4_ < 0xd) {
        local_130[0]._12_4_ = 0;
        local_130[0]._4_1_ = '\0';
        local_130[0]._5_1_ = '\0';
        local_130[0]._6_1_ = '\0';
        local_130[0]._7_1_ = '\0';
        local_130[0]._8_4_ = 0;
        if (local_130[0]._0_4_ != 0) {
          memcpy(local_130[0].pointer.prefix,__src,(ulong)(local_130[0]._0_4_ & 0xf));
        }
      }
      else {
        local_130[0]._8_4_ = SUB84(__src,0);
        local_130[0]._12_4_ = (undefined4)((ulong)__src >> 0x20);
      }
    }
    duckdb::Bit::SetEmptyBitString((string_t *)&local_130[0].pointer,iVar4);
    (state->value).value.pointer.length = local_130[0].pointer.length;
    *(undefined4 *)((long)&(state->value).value + 4) = local_130[0].pointer.prefix;
    *(undefined4 *)((long)&(state->value).value + 8) = local_130[0]._8_4_;
    *(undefined4 *)((long)&(state->value).value + 0xc) = local_130[0]._12_4_;
    state->is_set = true;
  }
  bVar2 = *input;
  if ((state->min <= bVar2) && (bVar2 <= state->max)) {
    uVar1 = duckdb::Value::GetValue<unsigned_char>();
    Execute<unsigned_char,duckdb::BitAggState<unsigned_char>>(state,bVar2,uVar1);
    return;
  }
  pOVar6 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_130[0].pointer,
             "Value %s is outside of provided min and max range (%s <-> %s)",&local_131);
  NumericHelper::ToString<unsigned_char>(&local_d0,*input);
  NumericHelper::ToString<unsigned_char>(&local_f0,state->min);
  NumericHelper::ToString<unsigned_char>(&local_110,state->max);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (pOVar6,(string *)&local_130[0].pointer,&local_d0,&local_f0,&local_110);
  __cxa_throw(pOVar6,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input) {
		auto &bind_agg_data = unary_input.input.bind_data->template Cast<BitstringAggBindData>();
		if (!state.is_set) {
			if (bind_agg_data.min.IsNull() || bind_agg_data.max.IsNull()) {
				throw BinderException(
				    "Could not retrieve required statistics. Alternatively, try by providing the statistics "
				    "explicitly: BITSTRING_AGG(col, min, max) ");
			}
			state.min = bind_agg_data.min.GetValue<INPUT_TYPE>();
			state.max = bind_agg_data.max.GetValue<INPUT_TYPE>();
			if (state.min > state.max) {
				throw InvalidInputException("Invalid explicit bitstring range: Minimum (%s) > maximum (%s)",
				                            NumericHelper::ToString(state.min), NumericHelper::ToString(state.max));
			}
			idx_t bit_range =
			    GetRange(bind_agg_data.min.GetValue<INPUT_TYPE>(), bind_agg_data.max.GetValue<INPUT_TYPE>());
			if (bit_range > MAX_BIT_RANGE) {
				throw OutOfRangeException(
				    "The range between min and max value (%s <-> %s) is too large for bitstring aggregation",
				    NumericHelper::ToString(state.min), NumericHelper::ToString(state.max));
			}
			idx_t len = Bit::ComputeBitstringLen(bit_range);
			auto target = len > string_t::INLINE_LENGTH ? string_t(new char[len], UnsafeNumericCast<uint32_t>(len))
			                                            : string_t(UnsafeNumericCast<uint32_t>(len));
			Bit::SetEmptyBitString(target, bit_range);

			state.value = target;
			state.is_set = true;
		}
		if (input >= state.min && input <= state.max) {
			Execute(state, input, bind_agg_data.min.GetValue<INPUT_TYPE>());
		} else {
			throw OutOfRangeException("Value %s is outside of provided min and max range (%s <-> %s)",
			                          NumericHelper::ToString(input), NumericHelper::ToString(state.min),
			                          NumericHelper::ToString(state.max));
		}
	}